

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,ValueType type)

{
  void *__s;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined1 local_c;
  
  local_c = (undefined1)in_ESI;
  *(undefined1 *)(in_RDI + 1) = local_c;
  *(byte *)((long)in_RDI + 9) = *(byte *)((long)in_RDI + 9) & 0xfe;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  switch(in_ESI) {
  case 0:
    break;
  case 1:
  case 2:
    *in_RDI = 0;
    break;
  case 3:
    *in_RDI = 0;
    break;
  case 4:
    *in_RDI = 0;
    break;
  case 5:
    *(undefined1 *)in_RDI = 0;
    break;
  case 6:
  case 7:
    __s = operator_new(0x30);
    memset(__s,0,0x30);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::map((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x12b8b5);
    *in_RDI = __s;
  }
  return;
}

Assistant:

Value::Value(ValueType type)
    : type_(type), allocated_(false)
#ifdef JSON_VALUE_USE_INTERNAL_MAP
      ,
      itemIsUsed_(0)
#endif
      ,
      comments_(0), start_(0), limit_(0) {
  switch (type) {
  case nullValue:
    break;
  case intValue:
  case uintValue:
    value_.int_ = 0;
    break;
  case realValue:
    value_.real_ = 0.0;
    break;
  case stringValue:
    value_.string_ = 0;
    break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues();
    break;
#else
  case arrayValue:
    value_.array_ = arrayAllocator()->newArray();
    break;
  case objectValue:
    value_.map_ = mapAllocator()->newMap();
    break;
#endif
  case booleanValue:
    value_.bool_ = false;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}